

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HighsHashTree.h
# Opt level: O0

void HighsHashTree<int,void>::mergeIntoLeaf<3,1>
               (InnerLeaf<3> *leaf,InnerLeaf<1> *mergeLeaf,int hashPos)

{
  reference this;
  long in_RSI;
  array<HighsHashTableEntry<int,_void>,_6UL> *in_RDI;
  Entry *in_stack_00000028;
  int i;
  size_type in_stack_ffffffffffffffb8;
  array<HighsHashTableEntry<int,_void>,_6UL> *this_00;
  undefined4 local_18;
  
  for (local_18 = 0; local_18 < *(int *)(in_RSI + 8); local_18 = local_18 + 1) {
    this_00 = in_RDI;
    this = std::array<HighsHashTableEntry<int,_void>,_6UL>::operator[]
                     (in_RDI,in_stack_ffffffffffffffb8);
    HighsHashTableEntry<int,_void>::key(this);
    HighsHashTree<int,_void>::compute_hash((int *)0x569ca5);
    std::array<HighsHashTableEntry<int,_void>,_6UL>::operator[](this_00,in_stack_ffffffffffffffb8);
    HighsHashTree<int,_void>::InnerLeaf<3>::insert_entry
              (leaf,(uint64_t)mergeLeaf,hashPos,in_stack_00000028);
  }
  return;
}

Assistant:

static void mergeIntoLeaf(InnerLeaf<SizeClass1>* leaf,
                            InnerLeaf<SizeClass2>* mergeLeaf, int hashPos) {
    for (int i = 0; i < mergeLeaf->size; ++i)
      leaf->insert_entry(compute_hash(mergeLeaf->entries[i].key()), hashPos,
                         mergeLeaf->entries[i]);
  }